

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

BMP * __thiscall BMP::getBit_abi_cxx11_(BMP *this,int a)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  uint in_EDX;
  undefined4 in_register_00000034;
  allocator local_1e;
  undefined1 local_1d;
  uint local_1c;
  undefined8 uStack_18;
  int a_local;
  BMP *this_local;
  string *x;
  
  uStack_18 = CONCAT44(in_register_00000034,a);
  local_1d = 0;
  local_1c = in_EDX;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  for (; local_1c != 0; local_1c = (int)local_1c >> 1) {
    if ((local_1c & 1) == 0) {
      std::__cxx11::string::operator+=((string *)this,'0');
    }
    else {
      std::__cxx11::string::operator+=((string *)this,'1');
    }
  }
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,__last);
  return this;
}

Assistant:

std::string BMP::getBit(int a)
{
    using namespace std;

    string x = "";
    while ( a != 0 ){
        if ( a & 1 ){
            x += '1';
        }
        else
            x += '0';
        a = a >> 1;

    }

    reverse( x.begin(), x.end() );

    return x;
}